

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::GenerateDefinition
          (ExtensionGenerator *this,Printer *printer)

{
  Options *options;
  bool bVar1;
  CppType CVar2;
  mapped_type *s;
  Descriptor *pDVar3;
  undefined1 qualified;
  Options *in_RCX;
  string *newsub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Descriptor *descriptor;
  allocator local_123;
  allocator local_122;
  allocator local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string default_str;
  key_type local_c0;
  string local_a0;
  string local_80;
  Formatter format;
  
  if (((this->options_).lite_implicit_weak_fields == true) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              **(undefined8 **)(*(long *)(this->descriptor_ + 0x20) + 0x10),
                              "net/proto2/proto/descriptor.proto"), bVar1)) {
    return;
  }
  format.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&format.vars_._M_t,&(this->variables_)._M_t);
  default_str._M_dataplus._M_p = (pointer)&default_str.field_2;
  default_str._M_string_length = 0;
  default_str.field_2._M_local_buf[0] = '\0';
  CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
  options = &this->options_;
  if (CVar2 == CPPTYPE_STRING) {
    std::__cxx11::string::string((string *)&local_c0,"scoped_name",&local_121);
    s = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->variables_,&local_c0);
    std::__cxx11::string::string((string *)&local_80,"::",&local_122);
    std::__cxx11::string::string((string *)&local_a0,"_",&local_123);
    newsub = &local_a0;
    StringReplace(&local_100,s,&local_80,newsub,true);
    std::operator+(&local_120,&local_100,"_default");
    std::__cxx11::string::operator=((string *)&default_str,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    DefaultValue_abi_cxx11_
              (&local_120,(cpp *)options,(Options *)this->descriptor_,(FieldDescriptor *)newsub);
    pbVar4 = &local_120;
    Formatter::operator()(&format,"const std::string $1$($2$);\n",&default_str,pbVar4);
    qualified = SUB81(pbVar4,0);
    pbVar4 = &local_120;
  }
  else {
    pDVar3 = FieldDescriptor::message_type(this->descriptor_);
    if (pDVar3 == (Descriptor *)0x0) {
      DefaultValue_abi_cxx11_
                (&local_120,(cpp *)options,(Options *)this->descriptor_,(FieldDescriptor *)in_RCX);
      qualified = SUB81(in_RCX,0);
      pbVar4 = &local_120;
      std::__cxx11::string::operator=((string *)&default_str,(string *)pbVar4);
    }
    else {
      FieldMessageTypeName_abi_cxx11_
                (&local_100,(cpp *)this->descriptor_,(FieldDescriptor *)options,in_RCX);
      qualified = SUB81(in_RCX,0);
      std::operator+(&local_120,&local_100,"::default_instance()");
      std::__cxx11::string::operator=((string *)&default_str,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      pbVar4 = &local_100;
    }
  }
  std::__cxx11::string::~string((string *)pbVar4);
  bVar1 = IsScoped(this);
  if (bVar1) {
    Formatter::operator()<>
              (&format,
               "#if !defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912)\nconst int $scope$$constant_name$;\n#endif\n"
              );
  }
  Formatter::operator()
            (&format,
             "PROTOBUF_ATTRIBUTE_INIT_PRIORITY ::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n  $scoped_name$($constant_name$, $1$);\n"
             ,&default_str);
  CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
  if (CVar2 == CPPTYPE_MESSAGE) {
    pDVar3 = FieldDescriptor::message_type(this->descriptor_);
    bVar1 = ShouldVerify(pDVar3,options,this->scc_analyzer_);
    if ((bVar1) &&
       (bVar1 = ShouldVerify(*(Descriptor **)(this->descriptor_ + 0x20),options,this->scc_analyzer_)
       , bVar1)) {
      pDVar3 = FieldDescriptor::message_type(this->descriptor_);
      ClassName_abi_cxx11_(&local_120,(cpp *)pDVar3,(Descriptor *)0x1,(bool)qualified);
      bVar1 = IsScoped(this);
      if (bVar1) {
        pDVar3 = FieldDescriptor::extension_scope(this->descriptor_);
        ClassName_abi_cxx11_(&local_100,(cpp *)pDVar3,descriptor);
      }
      else {
        std::__cxx11::string::string((string *)&local_100,"",(allocator *)&local_c0);
      }
      Formatter::operator()
                (&format,
                 "PROTOBUF_ATTRIBUTE_INIT_PRIORITY ::$proto_ns$::internal::RegisterExtensionVerify< $extendee$,\n    $1$, $number$> $2$_$name$_register;\n"
                 ,&local_120,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  std::__cxx11::string::~string((string *)&default_str);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&format.vars_._M_t);
  return;
}

Assistant:

void ExtensionGenerator::GenerateDefinition(io::Printer* printer) {
  // If we are building for lite with implicit weak fields, we want to skip over
  // any custom options (i.e. extensions of messages from descriptor.proto).
  // This prevents the creation of any unnecessary linker references to the
  // descriptor messages.
  if (options_.lite_implicit_weak_fields &&
      descriptor_->containing_type()->file()->name() ==
          "net/proto2/proto/descriptor.proto") {
    return;
  }

  Formatter format(printer, variables_);
  std::string default_str;
  // If this is a class member, it needs to be declared in its class scope.
  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    // We need to declare a global string which will contain the default value.
    // We cannot declare it at class scope because that would require exposing
    // it in the header which would be annoying for other reasons.  So we
    // replace :: with _ in the name and declare it as a global.
    default_str =
        StringReplace(variables_["scoped_name"], "::", "_", true) + "_default";
    format("const std::string $1$($2$);\n", default_str,
           DefaultValue(options_, descriptor_));
  } else if (descriptor_->message_type()) {
    // We have to initialize the default instance for extensions at registration
    // time.
    default_str =
        FieldMessageTypeName(descriptor_, options_) + "::default_instance()";
  } else {
    default_str = DefaultValue(options_, descriptor_);
  }

  // Likewise, class members need to declare the field constant variable.
  if (IsScoped()) {
    format(
        "#if !defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912)\n"
        "const int $scope$$constant_name$;\n"
        "#endif\n");
  }

  format(
      "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
      "::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n"
      "    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n"
      "  $scoped_name$($constant_name$, $1$);\n",
      default_str);

  // Register extension verify function if needed.
  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      ShouldVerify(descriptor_->message_type(), options_, scc_analyzer_) &&
      ShouldVerify(descriptor_->containing_type(), options_, scc_analyzer_)) {
    format(
        "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
        "::$proto_ns$::internal::RegisterExtensionVerify< $extendee$,\n"
        "    $1$, $number$> $2$_$name$_register;\n",
        ClassName(descriptor_->message_type(), true),
        IsScoped() ? ClassName(descriptor_->extension_scope(), false) : "");
  }
}